

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O3

void __thiscall
glcts::anon_unknown_0::UniformValue::UniformValue
          (UniformValue *this,UniformType *_type,UniformValueGenerator *generator)

{
  GLenum GVar1;
  pair<int,_int> pVar2;
  pointer pfVar3;
  pointer piVar4;
  undefined1 auVar5 [16];
  int iVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  GLfloat GVar16;
  undefined1 auVar17 [16];
  
  (this->uValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->uValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->iValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->iValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->fValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->iValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->fValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->fValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->uValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  UniformType::UniformType(&this->type,_type);
  pVar2 = (this->type).size;
  GVar1 = (this->type).baseType;
  iVar6 = pVar2.second;
  iVar11 = pVar2.first;
  if ((int)GVar1 < 0x1405) {
    if (GVar1 != 0) {
      if (GVar1 != 0x1404) {
LAB_00bb6149:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                      ,0x28c,
                      "glcts::(anonymous namespace)::UniformValue::UniformValue(const UniformType &, UniformValueGenerator &)"
                     );
      }
      if (iVar6 != 1) {
        __assert_fail("sizeColumn == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                      ,0x263,
                      "glcts::(anonymous namespace)::UniformValue::UniformValue(const UniformType &, UniformValueGenerator &)"
                     );
      }
      std::vector<int,_std::allocator<int>_>::resize
                (&this->iValues,(long)((this->type).arraySize * iVar11));
      piVar4 = (this->iValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar7 = (long)(this->iValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)piVar4;
      if (lVar7 != 0) {
        lVar7 = lVar7 >> 2;
        lVar9 = 0;
        do {
          iVar11 = generator->iValue + 1;
          generator->iValue = iVar11;
          piVar4[lVar9] = iVar11;
          lVar9 = lVar9 + 1;
        } while (lVar7 + (ulong)(lVar7 == 0) != lVar9);
      }
    }
  }
  else if (GVar1 == 0x1405) {
    if (iVar6 != 1) {
      __assert_fail("sizeColumn == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                    ,0x26c,
                    "glcts::(anonymous namespace)::UniformValue::UniformValue(const UniformType &, UniformValueGenerator &)"
                   );
    }
    std::vector<int,_std::allocator<int>_>::resize
              (&this->uValues,(long)((this->type).arraySize * iVar11));
    piVar4 = (this->uValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = (long)(this->uValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)piVar4;
    if (lVar7 != 0) {
      lVar7 = lVar7 >> 2;
      lVar9 = 0;
      do {
        iVar11 = generator->iValue + 1;
        generator->iValue = iVar11;
        piVar4[lVar9] = iVar11;
        lVar9 = lVar9 + 1;
      } while (lVar7 + (ulong)(lVar7 == 0) != lVar9);
    }
  }
  else if (GVar1 == 0x1406) {
    std::vector<float,_std::allocator<float>_>::resize
              (&this->fValues,(long)(iVar6 * iVar11 * (this->type).arraySize));
    pfVar3 = (this->fValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = (long)(this->fValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pfVar3;
    if (lVar7 != 0) {
      lVar7 = lVar7 >> 2;
      lVar9 = 0;
      do {
        uVar13 = -(uint)(99999.0 < generator->fValue);
        GVar16 = (GLfloat)(uVar13 & 0x3f800000 | ~uVar13 & (uint)(generator->fValue + 1.0));
        generator->fValue = GVar16;
        pfVar3[lVar9] = GVar16;
        lVar9 = lVar9 + 1;
      } while (lVar7 + (ulong)(lVar7 == 0) != lVar9);
    }
  }
  else {
    if (GVar1 != 0x82e6) goto LAB_00bb6149;
    std::vector<float,_std::allocator<float>_>::resize
              (&this->fValues,(long)((this->type).arraySize << 2));
    auVar5 = _DAT_019f5ce0;
    pfVar3 = (this->fValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = (long)(this->fValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pfVar3;
    if (lVar7 != 0) {
      uVar8 = lVar7 >> 2;
      lVar7 = uVar8 + (uVar8 == 0);
      lVar9 = lVar7 + -1;
      auVar14._8_4_ = (int)lVar9;
      auVar14._0_8_ = lVar9;
      auVar14._12_4_ = (int)((ulong)lVar9 >> 0x20);
      uVar10 = 0;
      auVar14 = auVar14 ^ _DAT_019f5ce0;
      auVar15 = _DAT_019fcc00;
      do {
        auVar17 = auVar15 ^ auVar5;
        if ((bool)(~(auVar17._4_4_ == auVar14._4_4_ && auVar14._0_4_ < auVar17._0_4_ ||
                    auVar14._4_4_ < auVar17._4_4_) & 1)) {
          pfVar3[uVar10] = (float)uVar10 / (float)uVar8;
        }
        if ((auVar17._12_4_ != auVar14._12_4_ || auVar17._8_4_ <= auVar14._8_4_) &&
            auVar17._12_4_ <= auVar14._12_4_) {
          pfVar3[uVar10 + 1] = (float)(uVar10 + 1) / (float)uVar8;
        }
        uVar10 = uVar10 + 2;
        lVar9 = auVar15._8_8_;
        auVar15._0_8_ = auVar15._0_8_ + 2;
        auVar15._8_8_ = lVar9 + 2;
      } while ((lVar7 + 1U & 0xfffffffffffffffe) != uVar10);
    }
    std::vector<int,_std::allocator<int>_>::resize(&this->iValues,(long)(this->type).arraySize);
    piVar4 = (this->iValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = (long)(this->iValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)piVar4;
    if (lVar7 != 0) {
      lVar7 = lVar7 >> 2;
      lVar9 = 0;
      do {
        iVar11 = generator->iValue;
        uVar13 = iVar11 + 1;
        generator->iValue = uVar13;
        uVar12 = iVar11 + 0x10;
        if (-1 < (int)uVar13) {
          uVar12 = uVar13;
        }
        piVar4[lVar9] = (iVar11 - (uVar12 & 0xfffffff0)) + 1;
        lVar9 = lVar9 + 1;
      } while (lVar7 + (ulong)(lVar7 == 0) != lVar9);
    }
  }
  return;
}

Assistant:

UniformValue(const UniformType& _type, UniformValueGenerator& generator) : type(_type)
	{
		const int sizeRow	= type.getSize().first;
		const int sizeColumn = type.getSize().second;

		if (type.isStruct())
		{
			return;
		}

		if (type.getBaseType() == GL_INT)
		{
			assert(sizeColumn == 1);
			iValues.resize(sizeRow * type.arraySize);
			for (size_t elem = 0; elem < iValues.size(); elem++)
			{
				iValues[elem] = generator.genI();
			}
		}
		else if (type.getBaseType() == GL_UNSIGNED_INT)
		{
			assert(sizeColumn == 1);
			uValues.resize(sizeRow * type.arraySize);
			for (size_t elem = 0; elem < uValues.size(); elem++)
			{
				uValues[elem] = static_cast<GLuint>(generator.genI());
			}
		}
		else if (type.getBaseType() == GL_FLOAT)
		{
			fValues.resize(sizeColumn * sizeRow * type.arraySize);
			for (size_t elem = 0; elem < fValues.size(); elem++)
			{
				fValues[elem] = generator.genF();
			}
		}
		else if (type.getBaseType() == GL_SAMPLER)
		{
			//color ref value
			fValues.resize(4 * type.arraySize);
			for (size_t elem = 0; elem < fValues.size(); elem++)
			{
				fValues[elem] = float(elem) / float(fValues.size());
			}
			//uniform value
			iValues.resize(type.arraySize);
			for (size_t elem = 0; elem < iValues.size(); elem++)
			{
				iValues[elem] = generator.genI() % 16;
			}
		}
		else
		{
			assert(0);
		}
	}